

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::end_function_scope
          (CombinedImageSamplerHandler *this,uint32_t *args,uint32_t length)

{
  value_type pSVar1;
  Compiler *pCVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRFunction *pSVar5;
  reference ppSVar6;
  CombinedImageSamplerParameter *pCVar7;
  VariableID local_84;
  uint32_t local_80;
  uint32_t local_7c;
  SPIRVariable *local_78;
  SPIRVariable *s;
  SPIRVariable *i;
  VariableID sampler_id;
  VariableID image_id;
  CombinedImageSamplerParameter *param;
  CombinedImageSamplerParameter *__end2;
  CombinedImageSamplerParameter *__begin2;
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *__range2;
  SPIRFunction *caller;
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *params;
  SPIRFunction *callee;
  uint32_t length_local;
  uint32_t *args_local;
  CombinedImageSamplerHandler *this_local;
  
  if (length < 3) {
    this_local._7_1_ = false;
  }
  else {
    pSVar5 = get<spirv_cross::SPIRFunction>(this->compiler,args[2]);
    pop_remap_parameters(this);
    pSVar5->do_combined_parameters = false;
    ppSVar6 = ::std::
              stack<spirv_cross::SPIRFunction_*,_std::deque<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>_>
              ::top(&this->functions);
    pSVar1 = *ppSVar6;
    ::std::
    stack<spirv_cross::SPIRFunction_*,_std::deque<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>_>
    ::pop(&this->functions);
    bVar3 = ::std::
            stack<spirv_cross::SPIRFunction_*,_std::deque<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>_>
            ::empty(&this->functions);
    if (bVar3) {
      this_local._7_1_ = true;
    }
    else {
      ppSVar6 = ::std::
                stack<spirv_cross::SPIRFunction_*,_std::deque<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>_>
                ::top(&this->functions);
      pSVar5 = *ppSVar6;
      if ((pSVar5->do_combined_parameters & 1U) != 0) {
        __end2 = VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>::begin
                           (&(pSVar1->combined_parameters).
                             super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>
                           );
        pCVar7 = VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>::end
                           (&(pSVar1->combined_parameters).
                             super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>
                           );
        for (; __end2 != pCVar7; __end2 = __end2 + 1) {
          _sampler_id = __end2;
          if ((__end2->global_image & 1U) == 0) {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end2->image_id);
            TypedID<(spirv_cross::Types)2>::TypedID
                      ((TypedID<(spirv_cross::Types)2> *)((long)&i + 4),args[(ulong)uVar4 + 3]);
          }
          else {
            i._4_4_ = (__end2->image_id).id;
          }
          if ((_sampler_id->global_sampler & 1U) == 0) {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_sampler_id->sampler_id);
            TypedID<(spirv_cross::Types)2>::TypedID
                      ((TypedID<(spirv_cross::Types)2> *)&i,args[(ulong)uVar4 + 3]);
          }
          else {
            i._0_4_ = (_sampler_id->sampler_id).id;
          }
          pCVar2 = this->compiler;
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&i + 4));
          s = maybe_get_backing_variable(pCVar2,uVar4);
          pCVar2 = this->compiler;
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&i);
          local_78 = maybe_get_backing_variable(pCVar2,uVar4);
          if (s != (SPIRVariable *)0x0) {
            local_7c = (uint32_t)
                       TypedID::operator_cast_to_TypedID((TypedID *)&(s->super_IVariant).self);
            i._4_4_ = (TypedID<(spirv_cross::Types)2>)local_7c;
          }
          if (local_78 != (SPIRVariable *)0x0) {
            local_80 = (uint32_t)
                       TypedID::operator_cast_to_TypedID
                                 ((TypedID *)&(local_78->super_IVariant).self);
            i._0_4_ = (TypedID<(spirv_cross::Types)2>)local_80;
          }
          TypedID<(spirv_cross::Types)2>::TypedID(&local_84,0);
          register_combined_image_sampler
                    (this,pSVar5,local_84,(VariableID)i._4_4_,(VariableID)i._0_4_,
                     (bool)(_sampler_id->depth & 1));
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::end_function_scope(const uint32_t *args, uint32_t length)
{
	if (length < 3)
		return false;

	auto &callee = compiler.get<SPIRFunction>(args[2]);
	args += 3;

	// There are two types of cases we have to handle,
	// a callee might call sampler2D(texture2D, sampler) directly where
	// one or more parameters originate from parameters.
	// Alternatively, we need to provide combined image samplers to our callees,
	// and in this case we need to add those as well.

	pop_remap_parameters();

	// Our callee has now been processed at least once.
	// No point in doing it again.
	callee.do_combined_parameters = false;

	auto &params = functions.top()->combined_parameters;
	functions.pop();
	if (functions.empty())
		return true;

	auto &caller = *functions.top();
	if (caller.do_combined_parameters)
	{
		for (auto &param : params)
		{
			VariableID image_id = param.global_image ? param.image_id : VariableID(args[param.image_id]);
			VariableID sampler_id = param.global_sampler ? param.sampler_id : VariableID(args[param.sampler_id]);

			auto *i = compiler.maybe_get_backing_variable(image_id);
			auto *s = compiler.maybe_get_backing_variable(sampler_id);
			if (i)
				image_id = i->self;
			if (s)
				sampler_id = s->self;

			register_combined_image_sampler(caller, 0, image_id, sampler_id, param.depth);
		}
	}

	return true;
}